

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureSpecCase::readPixels
          (TextureSpecCase *this,Surface *dst,int x,int y,int width,int height)

{
  int height_00;
  int width_00;
  int y_00;
  int x_00;
  void *data;
  PixelBufferAccess local_50;
  int local_28;
  int local_24;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Surface *dst_local;
  TextureSpecCase *this_local;
  
  local_28 = height;
  local_24 = width;
  height_local = y;
  width_local = x;
  _y_local = dst;
  dst_local = (Surface *)this;
  tcu::Surface::setSize(dst,width,height);
  x_00 = width_local;
  y_00 = height_local;
  width_00 = local_24;
  height_00 = local_28;
  tcu::Surface::getAccess(&local_50,_y_local);
  data = tcu::PixelBufferAccess::getDataPtr(&local_50);
  sglr::ContextWrapper::glReadPixels
            (&this->super_ContextWrapper,x_00,y_00,width_00,height_00,0x1908,0x1401,data);
  return;
}

Assistant:

void TextureSpecCase::readPixels (tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	glReadPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}